

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

void __thiscall
fmt::v11::detail::buffer<wchar_t>::append<wchar_t>
          (buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  wchar_t *pwVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  for (; begin != end; begin = begin + uVar3) {
    uVar5 = (long)end - (long)begin >> 2;
    sVar2 = this->size_;
    uVar4 = this->capacity_;
    if (uVar4 < sVar2 + uVar5) {
      (*this->grow_)(this,sVar2 + uVar5);
      sVar2 = this->size_;
      uVar4 = this->capacity_;
    }
    uVar3 = uVar4 - sVar2;
    if (uVar5 <= uVar4 - sVar2) {
      uVar3 = uVar5;
    }
    pwVar1 = this->ptr_;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      pwVar1[sVar2 + uVar4] = begin[uVar4];
    }
    this->size_ = sVar2 + uVar3;
  }
  return;
}

Assistant:

void
      append(const U* begin, const U* end) {
    while (begin != end) {
      auto count = to_unsigned(end - begin);
      try_reserve(size_ + count);
      auto free_cap = capacity_ - size_;
      if (free_cap < count) count = free_cap;
      // A loop is faster than memcpy on small sizes.
      T* out = ptr_ + size_;
      for (size_t i = 0; i < count; ++i) out[i] = begin[i];
      size_ += count;
      begin += count;
    }
  }